

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O1

void __thiscall docopt::LeafPattern::setValue(LeafPattern *this,value *v)

{
  pointer *ppbVar1;
  pointer *ppbVar2;
  Kind KVar3;
  pointer pbVar4;
  size_type sVar5;
  undefined8 uVar6;
  
  KVar3 = (this->fValue).kind;
  if (KVar3 == StringList) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&(this->fValue).variant.strList);
  }
  else if ((KVar3 == String) &&
          (pbVar4 = (this->fValue).variant.strList.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          pbVar4 != (pointer)((long)&(this->fValue).variant + 0x10))) {
    operator_delete(pbVar4);
  }
  KVar3 = v->kind;
  (this->fValue).kind = KVar3;
  switch(KVar3) {
  case Bool:
    (this->fValue).variant.boolValue = (v->variant).boolValue;
    break;
  case Long:
    (this->fValue).variant.longValue = (v->variant).longValue;
    break;
  case String:
    ppbVar1 = &(this->fValue).variant.strList.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->fValue).variant.strList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
    ppbVar2 = &(v->variant).strList.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((pointer *)(v->variant).longValue == ppbVar2) {
      uVar6 = *(undefined8 *)((long)&v->variant + 0x18);
      *ppbVar1 = *ppbVar2;
      *(undefined8 *)((long)&(this->fValue).variant + 0x18) = uVar6;
    }
    else {
      (this->fValue).variant.longValue = (long)(v->variant).longValue;
      (this->fValue).variant.strList.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = *ppbVar2;
    }
    (this->fValue).variant.strValue._M_string_length = (v->variant).strValue._M_string_length;
    (v->variant).strList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar2;
    (v->variant).strValue._M_string_length = 0;
    *(undefined1 *)((long)&v->variant + 0x10) = 0;
    break;
  case StringList:
    sVar5 = (v->variant).strValue._M_string_length;
    (this->fValue).variant.longValue = (v->variant).longValue;
    (this->fValue).variant.strValue._M_string_length = sVar5;
    (this->fValue).variant.strList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (v->variant).strList.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (v->variant).longValue = 0;
    (v->variant).strValue._M_string_length = 0;
    (v->variant).strList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return;
}

Assistant:

void setValue(value&& v) { fValue = std::move(v); }